

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastunpack16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t outer;
  uint32_t inwordpointer;
  int iVar2;
  
  outer = 0;
  do {
    uVar1 = *in;
    iVar2 = 0;
    do {
      *out = uVar1 >> ((byte)iVar2 & 0x1f) & 0xffff;
      out = out + 1;
      iVar2 = iVar2 + 0x10;
    } while (iVar2 == 0x10);
    in = in + 1;
    outer = outer + 1;
  } while (outer != 0x10);
  return;
}

Assistant:

void __fastunpack16(const uint32_t *__restrict in, uint32_t *__restrict out) {
	for (uint32_t outer = 0; outer < 16; ++outer) {
		for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
			*(out++) = ((*in) >> inwordpointer) % (1U << 16);
		++in;
	}
}